

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLtree.c
# Opt level: O2

xmlChar * htmlGetMetaEncoding(htmlDocPtr doc)

{
  _xmlAttr *p_Var1;
  _xmlNode *p_Var2;
  bool bVar3;
  int iVar4;
  xmlChar *pxVar5;
  _xmlNode **pp_Var6;
  _xmlNode *p_Var7;
  _xmlAttr **pp_Var8;
  xmlChar *str;
  
  if (doc != (htmlDocPtr)0x0) {
    pp_Var6 = &doc->children;
    while (p_Var7 = *pp_Var6, p_Var7 != (_xmlNode *)0x0) {
      if ((p_Var7->type == XML_ELEMENT_NODE) && (p_Var7->name != (xmlChar *)0x0)) {
        iVar4 = xmlStrEqual(p_Var7->name,"html");
        if (iVar4 != 0) {
          pp_Var6 = &p_Var7->children;
          do {
            p_Var7 = *pp_Var6;
            if (p_Var7 == (_xmlNode *)0x0) {
              return (xmlChar *)0x0;
            }
            if ((p_Var7->type == XML_ELEMENT_NODE) && (p_Var7->name != (xmlChar *)0x0)) {
              iVar4 = xmlStrEqual(p_Var7->name,"head");
              if (iVar4 != 0) {
LAB_001502ca:
                pp_Var6 = &p_Var7->children;
                goto LAB_001502e5;
              }
              iVar4 = xmlStrEqual(p_Var7->name,(xmlChar *)"meta");
              if (iVar4 != 0) {
LAB_001502e8:
                do {
                  if (p_Var7 == (_xmlNode *)0x0) {
                    return (xmlChar *)0x0;
                  }
                  if (((p_Var7->type == XML_ELEMENT_NODE) && (p_Var7->name != (xmlChar *)0x0)) &&
                     (iVar4 = xmlStrEqual(p_Var7->name,(xmlChar *)"meta"), iVar4 != 0)) {
                    str = (xmlChar *)0x0;
                    bVar3 = false;
                    pp_Var8 = &p_Var7->properties;
                    while (p_Var1 = *pp_Var8, p_Var1 != (_xmlAttr *)0x0) {
                      p_Var2 = p_Var1->children;
                      if (((p_Var2 != (_xmlNode *)0x0) && (p_Var2->type == XML_TEXT_NODE)) &&
                         (p_Var2->next == (_xmlNode *)0x0)) {
                        pxVar5 = p_Var2->content;
                        iVar4 = xmlStrcasecmp(p_Var1->name,(xmlChar *)"http-equiv");
                        if ((iVar4 == 0) &&
                           (iVar4 = xmlStrcasecmp(pxVar5,(xmlChar *)"Content-Type"), iVar4 == 0)) {
                          bVar3 = true;
                        }
                        else if ((pxVar5 != (xmlChar *)0x0) &&
                                (iVar4 = xmlStrcasecmp(p_Var1->name,"content"), iVar4 == 0)) {
                          str = pxVar5;
                        }
                        if ((bVar3) && (str != (xmlChar *)0x0)) {
                          pxVar5 = xmlStrstr(str,"charset=");
                          if ((pxVar5 == (xmlChar *)0x0) &&
                             ((pxVar5 = xmlStrstr(str,(xmlChar *)"Charset="),
                              pxVar5 == (xmlChar *)0x0 &&
                              (pxVar5 = xmlStrstr(str,(xmlChar *)"CHARSET="),
                              pxVar5 == (xmlChar *)0x0)))) {
                            pxVar5 = xmlStrstr(str,(xmlChar *)"charset =");
                            if (((pxVar5 == (xmlChar *)0x0) &&
                                (pxVar5 = xmlStrstr(str,(xmlChar *)"Charset ="),
                                pxVar5 == (xmlChar *)0x0)) &&
                               (pxVar5 = xmlStrstr(str,(xmlChar *)"CHARSET ="),
                               pxVar5 == (xmlChar *)0x0)) {
                              return (xmlChar *)0x0;
                            }
                            pxVar5 = pxVar5 + 9;
                          }
                          else {
                            pxVar5 = pxVar5 + 8;
                          }
                          for (; (*pxVar5 == ' ' || (*pxVar5 == '\t')); pxVar5 = pxVar5 + 1) {
                          }
                          return pxVar5;
                        }
                      }
                      pp_Var8 = &p_Var1->next;
                    }
                  }
                  pp_Var6 = &p_Var7->next;
LAB_001502e5:
                  p_Var7 = *pp_Var6;
                } while( true );
              }
            }
            pp_Var6 = &p_Var7->next;
          } while( true );
        }
        iVar4 = xmlStrEqual(p_Var7->name,"head");
        if (iVar4 != 0) goto LAB_001502ca;
        iVar4 = xmlStrEqual(p_Var7->name,(xmlChar *)"meta");
        if (iVar4 != 0) goto LAB_001502e8;
      }
      pp_Var6 = &p_Var7->next;
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

const xmlChar *
htmlGetMetaEncoding(htmlDocPtr doc) {
    htmlNodePtr cur;
    const xmlChar *content;
    const xmlChar *encoding;

    if (doc == NULL)
	return(NULL);
    cur = doc->children;

    /*
     * Search the html
     */
    while (cur != NULL) {
	if ((cur->type == XML_ELEMENT_NODE) && (cur->name != NULL)) {
	    if (xmlStrEqual(cur->name, BAD_CAST"html"))
		break;
	    if (xmlStrEqual(cur->name, BAD_CAST"head"))
		goto found_head;
	    if (xmlStrEqual(cur->name, BAD_CAST"meta"))
		goto found_meta;
	}
	cur = cur->next;
    }
    if (cur == NULL)
	return(NULL);
    cur = cur->children;

    /*
     * Search the head
     */
    while (cur != NULL) {
	if ((cur->type == XML_ELEMENT_NODE) && (cur->name != NULL)) {
	    if (xmlStrEqual(cur->name, BAD_CAST"head"))
		break;
	    if (xmlStrEqual(cur->name, BAD_CAST"meta"))
		goto found_meta;
	}
	cur = cur->next;
    }
    if (cur == NULL)
	return(NULL);
found_head:
    cur = cur->children;

    /*
     * Search the meta elements
     */
found_meta:
    while (cur != NULL) {
	if ((cur->type == XML_ELEMENT_NODE) && (cur->name != NULL)) {
	    if (xmlStrEqual(cur->name, BAD_CAST"meta")) {
		xmlAttrPtr attr = cur->properties;
		int http;
		const xmlChar *value;

		content = NULL;
		http = 0;
		while (attr != NULL) {
		    if ((attr->children != NULL) &&
		        (attr->children->type == XML_TEXT_NODE) &&
		        (attr->children->next == NULL)) {
			value = attr->children->content;
			if ((!xmlStrcasecmp(attr->name, BAD_CAST"http-equiv"))
			 && (!xmlStrcasecmp(value, BAD_CAST"Content-Type")))
			    http = 1;
			else if ((value != NULL)
			 && (!xmlStrcasecmp(attr->name, BAD_CAST"content")))
			    content = value;
			if ((http != 0) && (content != NULL))
			    goto found_content;
		    }
		    attr = attr->next;
		}
	    }
	}
	cur = cur->next;
    }
    return(NULL);

found_content:
    encoding = xmlStrstr(content, BAD_CAST"charset=");
    if (encoding == NULL)
	encoding = xmlStrstr(content, BAD_CAST"Charset=");
    if (encoding == NULL)
	encoding = xmlStrstr(content, BAD_CAST"CHARSET=");
    if (encoding != NULL) {
	encoding += 8;
    } else {
	encoding = xmlStrstr(content, BAD_CAST"charset =");
	if (encoding == NULL)
	    encoding = xmlStrstr(content, BAD_CAST"Charset =");
	if (encoding == NULL)
	    encoding = xmlStrstr(content, BAD_CAST"CHARSET =");
	if (encoding != NULL)
	    encoding += 9;
    }
    if (encoding != NULL) {
	while ((*encoding == ' ') || (*encoding == '\t')) encoding++;
    }
    return(encoding);
}